

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O3

void __thiscall
Assimp::Q3BSPFileImporter::CreateNodes
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiNode *pParent)

{
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *rArray;
  pointer ppsVar1;
  aiNode *paVar2;
  pointer ppsVar3;
  _Rb_tree_node_base *p_Var4;
  aiMesh **ppaVar5;
  ulong uVar6;
  aiNode **ppaVar7;
  long lVar8;
  ulong uVar9;
  iterator iVar10;
  uint uVar11;
  aiMesh **ppaVar12;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  vector<aiNode_*,_std::allocator<aiNode_*>_> NodeArray;
  aiMesh *pMesh;
  aiNode *pNode;
  aiMesh **local_88;
  iterator iStack_80;
  aiMesh **local_78;
  aiNode **local_68;
  iterator iStack_60;
  aiNode **local_58;
  aiMesh *local_48;
  aiScene *local_40;
  aiNode *local_38;
  
  if (pModel != (Q3BSPModel *)0x0) {
    local_88 = (aiMesh **)0x0;
    iStack_80._M_current = (aiMesh **)0x0;
    uVar11 = 0;
    local_78 = (aiMesh **)0x0;
    local_58 = (aiNode **)0x0;
    local_68 = (aiNode **)0x0;
    iStack_60._M_current = (aiNode **)0x0;
    p_Var4 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ppaVar12 = local_88;
    iVar10._M_current = iStack_80._M_current;
    while (local_88 = ppaVar12, iStack_80._M_current = iVar10._M_current, local_40 = pScene,
          (_Rb_tree_header *)p_Var4 !=
          &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header) {
      rArray = *(vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                 **)(p_Var4 + 2);
      ppsVar3 = (rArray->
                super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppsVar1 = (rArray->
                super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (ppsVar3 != ppsVar1) {
        lVar8 = 0;
        do {
          if (((*ppsVar3)->iType | 2U) == 3) {
            lVar8 = lVar8 + (*ppsVar3)->iNumOfFaceVerts;
          }
          ppsVar3 = ppsVar3 + 1;
        } while (ppsVar3 != ppsVar1);
        if (lVar8 != 0) {
          local_48 = (aiMesh *)0x0;
          local_38 = CreateTopology(this,pModel,uVar11,rArray,&local_48);
          if (local_38 != (aiNode *)0x0) {
            if (iStack_60._M_current == local_58) {
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_68,iStack_60,&local_38);
            }
            else {
              *iStack_60._M_current = local_38;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
            if (iStack_80._M_current == local_78) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_88,iStack_80,&local_48);
            }
            else {
              *iStack_80._M_current = local_48;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      pScene = local_40;
      ppaVar12 = local_88;
      iVar10._M_current = iStack_80._M_current;
    }
    uVar9 = (long)iVar10._M_current - (long)ppaVar12;
    uVar11 = (uint)(uVar9 >> 3);
    pScene->mNumMeshes = uVar11;
    if (uVar11 != 0) {
      ppaVar5 = (aiMesh **)operator_new__(uVar9 & 0x7fffffff8);
      pScene->mMeshes = ppaVar5;
      if (iVar10._M_current == ppaVar12) {
        uVar9 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (ppaVar12[uVar6] != (aiMesh *)0x0) {
            pScene->mMeshes[uVar6] = ppaVar12[uVar6];
            iVar10._M_current = iStack_80._M_current;
            ppaVar12 = local_88;
          }
          uVar6 = uVar6 + 1;
          uVar9 = (long)iVar10._M_current - (long)ppaVar12;
        } while (uVar6 < (ulong)((long)uVar9 >> 3));
      }
    }
    pParent->mNumChildren = (uint)(uVar9 >> 3);
    ppaVar7 = (aiNode **)operator_new__((ulong)pScene->mRootNode->mNumChildren << 3);
    pParent->mChildren = ppaVar7;
    if (iStack_60._M_current != local_68) {
      uVar9 = 0;
      do {
        paVar2 = local_68[uVar9];
        paVar2->mParent = pParent;
        pParent->mChildren[uVar9] = paVar2;
        *pParent->mChildren[uVar9]->mMeshes = (uint)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 3));
    }
    if (local_68 != (aiNode **)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
    if (local_88 != (aiMesh **)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return;
}

Assistant:

void Q3BSPFileImporter::CreateNodes( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
        aiNode *pParent ) {
    if ( nullptr == pModel ) {
        return;
    }

    unsigned int matIdx( 0 );
    std::vector<aiMesh*> MeshArray;
    std::vector<aiNode*> NodeArray;
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end(); ++it ) {
        std::vector<Q3BSP::sQ3BSPFace*> *pArray = (*it).second;
        size_t numVerts = countData( *pArray );
        if ( 0 != numVerts ) {
            aiMesh *pMesh( nullptr );
            aiNode *pNode = CreateTopology( pModel, matIdx, *pArray, &pMesh );
            if ( nullptr != pNode ) {
                NodeArray.push_back( pNode );
                MeshArray.push_back( pMesh );
            }
        }
        matIdx++;
    }

    pScene->mNumMeshes = static_cast<unsigned int>( MeshArray.size() );
    if ( pScene->mNumMeshes > 0 ) {
        pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];
        for ( size_t i = 0; i < MeshArray.size(); i++ ) {
            aiMesh *pMesh = MeshArray[ i ];
            if ( nullptr != pMesh ) {
                pScene->mMeshes[ i ] = pMesh;
            }
        }
    }

    pParent->mNumChildren = static_cast<unsigned int>(MeshArray.size());
    pParent->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren ];
    for ( size_t i=0; i<NodeArray.size(); i++ ) {
        aiNode *pNode = NodeArray[ i ];
        pNode->mParent = pParent;
        pParent->mChildren[ i ] = pNode;
        pParent->mChildren[ i ]->mMeshes[ 0 ] = static_cast<unsigned int>(i);
    }
}